

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O1

int __thiscall Socket::Poll::Private::poll(Private *this,pollfd *__fds,nfds_t __nfds,int __timeout)

{
  HashMap<Socket_*,_unsigned_int> *this_00;
  uint uVar1;
  Socket **key;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  Iterator IVar5;
  epoll_event *__events;
  uint64 val;
  Iterator it;
  uint local_348 [2];
  pollfd *local_340;
  epoll_event local_338 [48];
  
  this_00 = &this->selectedSockets;
  if ((this->selectedSockets).endItem.prev == (Item *)0x0) {
    __events = local_338;
    uVar4 = epoll_wait(this->fd,__events,0x40,(int)__nfds);
    IVar5.item = (Item *)(ulong)uVar4;
    if ((int)uVar4 < 1) {
      bVar3 = false;
    }
    else {
      bVar3 = false;
      local_340 = __fds;
      do {
        key = *(Socket ***)&__events->field_0x4;
        if (key == (Socket **)0x0) {
          IVar5.item = (Item *)0x0;
          if ((__events->events & 1) != 0) {
            bVar3 = true;
          }
        }
        else {
          uVar1 = __events->events;
          local_348[0] = *(uint *)(key + 1) & 5;
          if ((uVar1 & 0x2011) == 0) {
            local_348[0] = 0;
          }
          if ((uVar1 & 4) == 0) {
            if (local_348[0] == 0) {
              if ((uVar1 & 0x2010) != 0) goto LAB_00111064;
              local_348[0] = 0;
            }
          }
          else {
LAB_00111064:
            local_348[0] = local_348[0] | *(uint *)(key + 1) & 10;
          }
          IVar5 = HashMap<Socket_*,_unsigned_int>::insert(this_00,&this_00->_end,key,local_348);
        }
        __events = (epoll_event *)((long)&__events->data + 4);
        __fds = local_340;
      } while (__events < (epoll_event *)(&local_338[0].events + (long)(int)uVar4 * 3));
    }
    if (((this->selectedSockets).endItem.prev == (Item *)0x0) || (bVar3)) {
      if ((bVar3) &&
         (IVar5.item = (Item *)read(this->eventFd,local_348,8), IVar5.item != (Item *)0x8)) {
        uVar4 = Debug::printf("%s:%u: verification failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]dehprox/3rdparty/libnstd/src/Socket/Socket.cpp"
                              ,0x502,"read(eventFd, &val, sizeof(val)) == sizeof(val)");
        IVar5.item = (Item *)(ulong)uVar4;
        if (uVar4 != 0) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
      }
      __fds->fd = 0;
      __fds[1].fd = 0;
      __fds[1].events = 0;
      __fds[1].revents = 0;
      goto LAB_001110d8;
    }
  }
  local_338[0]._0_8_ = (this->selectedSockets)._begin.item;
  __fds[1] = (pollfd)((Item *)local_338[0]._0_8_)->key;
  __fds->fd = ((Item *)local_338[0]._0_8_)->value;
  uVar4 = HashMap<Socket_*,_unsigned_int>::remove(this_00,(char *)local_338);
  IVar5.item = (Item *)(ulong)uVar4;
LAB_001110d8:
  return (int)CONCAT71((int7)((ulong)IVar5.item >> 8),1);
}

Assistant:

bool Socket::Poll::Private::poll(Event& event, int64 timeout)
{
  if(selectedSockets.isEmpty())
  {
    epoll_event events[64];
    int count = ::epoll_wait(fd, events, sizeof(events) / sizeof(*events), timeout);
    bool interrupted = false;
    for(epoll_event* i = events, * end = events + count; i < end; ++i)
    {
      Private::SocketInfo* sockInfo = (Private::SocketInfo*)i->data.ptr;
      if(sockInfo)
        selectedSockets.append(sockInfo->socket, unmapEvents(i->events, sockInfo->events));
      else if(i->events & EPOLLIN)
        interrupted = true;
    }

    if(selectedSockets.isEmpty() || interrupted)
    {
      if(interrupted)
      {
        uint64 val;
        VERIFY(read(eventFd, &val, sizeof(val)) == sizeof(val));
      }
      event.flags = 0;
      event.socket = 0;
      return true; // timeout or interrupt
    }
  }

  HashMap<Socket*, uint>::Iterator it = selectedSockets.begin();
  event.socket = it.key();
  event.flags = *it;
  selectedSockets.remove(it);
  return true;
}